

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralType.cc
# Opt level: O1

LiteralType __thiscall flow::elementTypeOf(flow *this,LiteralType type)

{
  char *pcVar1;
  char *pcVar2;
  
  if (((uint)this < 0xd) && ((0x1fefU >> ((uint)this & 0x1f) & 1) != 0)) {
    return *(LiteralType *)(&DAT_00171ab8 + ((ulong)this & 0xffffffff) * 4);
  }
  elementTypeOf();
  switch(type) {
  case Void:
    *(string **)this = (string *)this + 0x10;
    pcVar2 = "Same";
    pcVar1 = "";
    break;
  case Boolean:
    *(string **)this = (string *)this + 0x10;
    pcVar2 = "Head";
    pcVar1 = "";
    break;
  case Number:
    *(string **)this = (string *)this + 0x10;
    pcVar2 = "Tail";
    pcVar1 = "";
    break;
  case String:
    *(string **)this = (string *)this + 0x10;
    pcVar2 = "RegExp";
    pcVar1 = "";
    break;
  default:
    __assert_fail("!\"FIXME: NOT IMPLEMENTED\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/MatchClass.cc"
                  ,0x18,"std::string flow::tos(MatchClass)");
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)this,pcVar2,pcVar1);
  return (LiteralType)this;
}

Assistant:

LiteralType elementTypeOf(LiteralType type) {
  switch (type) {
    case LiteralType::Void:
    case LiteralType::Boolean:
    case LiteralType::Number:
    case LiteralType::String:
    case LiteralType::IPAddress:
    case LiteralType::Cidr:
    case LiteralType::RegExp:
    case LiteralType::Handler:
      return type;
    case LiteralType::IntArray:
      return LiteralType::Number;
    case LiteralType::StringArray:
      return LiteralType::String;
    case LiteralType::IPAddrArray:
      return LiteralType::IPAddress;
    case LiteralType::CidrArray:
      return LiteralType::Cidr;
    default:
      FLOW_ASSERT(false, "InvalidArgumentError");
  }
}